

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O0

ChVector<double> * __thiscall
chrono::ChFrameMoving<double>::PointAccelerationLocalToParent
          (ChVector<double> *__return_storage_ptr__,ChFrameMoving<double> *this,
          ChVector<double> *localpos,ChVector<double> *localspeed,ChVector<double> *localacc)

{
  ChQuaternion<double> local_2a0;
  ChQuaternion<double> local_280;
  ChQuaternion<double> local_260;
  ChQuaternion<double> local_240;
  ChVector<double> local_220;
  ChVector<double> local_208;
  ChQuaternion<double> local_1f0;
  ChQuaternion<double> local_1d0;
  ChQuaternion<double> local_1b0;
  ChQuaternion<double> local_190;
  ChVector<double> local_170;
  ChVector<double> local_158;
  ChQuaternion<double> local_140;
  ChQuaternion<double> local_120;
  ChQuaternion<double> local_100;
  ChQuaternion<double> local_e0;
  ChVector<double> local_c0;
  ChVector<double> local_a8;
  ChVector<double> local_90;
  ChVector<double> local_78;
  ChVector<double> local_60;
  ChVector<double> local_48;
  ChVector<double> *local_30;
  ChVector<double> *localacc_local;
  ChVector<double> *localspeed_local;
  ChVector<double> *localpos_local;
  ChFrameMoving<double> *this_local;
  
  local_30 = localacc;
  localacc_local = localspeed;
  localspeed_local = localpos;
  localpos_local = (ChVector<double> *)this;
  this_local = (ChFrameMoving<double> *)__return_storage_ptr__;
  ChMatrix33<double>::operator*(&local_90,&(this->super_ChFrame<double>).Amatrix,localacc);
  ChVector<double>::operator+(&local_78,&(this->coord_dtdt).pos,&local_90);
  ChQuaternion<double>::ChQuaternion(&local_120,0.0,localspeed_local);
  ChQuaternion<double>::operator%(&local_100,&(this->coord_dtdt).rot,&local_120);
  ChQuaternion<double>::GetConjugate(&local_140,&(this->super_ChFrame<double>).coord.rot);
  ChQuaternion<double>::operator%(&local_e0,&local_100,&local_140);
  ChQuaternion<double>::GetVector(&local_c0,&local_e0);
  ChVector<double>::operator*(&local_a8,&local_c0,2.0);
  ChVector<double>::operator+(&local_60,&local_78,&local_a8);
  ChQuaternion<double>::ChQuaternion(&local_1d0,0.0,localspeed_local);
  ChQuaternion<double>::operator%(&local_1b0,&(this->coord_dt).rot,&local_1d0);
  ChQuaternion<double>::GetConjugate(&local_1f0,&(this->coord_dt).rot);
  ChQuaternion<double>::operator%(&local_190,&local_1b0,&local_1f0);
  ChQuaternion<double>::GetVector(&local_170,&local_190);
  ChVector<double>::operator*(&local_158,&local_170,2.0);
  ChVector<double>::operator+(&local_48,&local_60,&local_158);
  ChQuaternion<double>::ChQuaternion(&local_280,0.0,localacc_local);
  ChQuaternion<double>::operator%(&local_260,&(this->coord_dt).rot,&local_280);
  ChQuaternion<double>::GetConjugate(&local_2a0,&(this->super_ChFrame<double>).coord.rot);
  ChQuaternion<double>::operator%(&local_240,&local_260,&local_2a0);
  ChQuaternion<double>::GetVector(&local_220,&local_240);
  ChVector<double>::operator*(&local_208,&local_220,4.0);
  ChVector<double>::operator+(__return_storage_ptr__,&local_48,&local_208);
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> PointAccelerationLocalToParent(const ChVector<Real>& localpos,
                                                  const ChVector<Real>& localspeed,
                                                  const ChVector<Real>& localacc) const {
        return coord_dtdt.pos + this->Amatrix * localacc +
               ((coord_dtdt.rot % ChQuaternion<Real>(0, localpos) % this->coord.rot.GetConjugate()).GetVector() * 2) +
               ((coord_dt.rot % ChQuaternion<Real>(0, localpos) % coord_dt.rot.GetConjugate()).GetVector() * 2) +
               ((coord_dt.rot % ChQuaternion<Real>(0, localspeed) % this->coord.rot.GetConjugate()).GetVector() * 4);
    }